

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

color_rgba basisu::etc_block::unpack_color4(uint16_t packed_color4,bool scaled,uint32_t alpha)

{
  uint sg;
  eNoClamp sb;
  uint sa;
  uint in_EDX;
  byte in_SIL;
  ushort in_DI;
  uint32_t r;
  uint32_t g;
  uint32_t b;
  uint sr;
  eNoClamp eVar1;
  uint uVar2;
  undefined4 local_4;
  
  sg = in_DI & 0xf;
  sb = (int)(uint)in_DI >> 4 & 0xf;
  sa = (int)(uint)in_DI >> 8 & 0xf;
  if ((in_SIL & 1) != 0) {
    sg = sg << 4 | sg;
    sb = sb << 4 | sb;
    sa = sa << 4 | sa;
  }
  sr = sa;
  eVar1 = sb;
  uVar2 = sg;
  minimum<unsigned_int>(in_EDX,0xff);
  color_rgba::color_rgba((color_rgba *)CONCAT44(in_EDX,uVar2),eVar1,sr,sg,sb,sa);
  return (anon_union_4_2_6eba8969_for_color_rgba_0)(anon_union_4_2_6eba8969_for_color_rgba_0)local_4
  ;
}

Assistant:

color_rgba etc_block::unpack_color4(uint16_t packed_color4, bool scaled, uint32_t alpha)
	{
		uint32_t b = packed_color4 & 15U;
		uint32_t g = (packed_color4 >> 4U) & 15U;
		uint32_t r = (packed_color4 >> 8U) & 15U;

		if (scaled)
		{
			b = (b << 4U) | b;
			g = (g << 4U) | g;
			r = (r << 4U) | r;
		}

		return color_rgba(cNoClamp, r, g, b, minimum(alpha, 255U));
	}